

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

LightLeSample * __thiscall
pbrt::GoniometricLight::SampleLe
          (LightLeSample *__return_storage_ptr__,GoniometricLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  uintptr_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar21 [16];
  undefined1 auVar23 [56];
  undefined1 auVar24 [16];
  SampledSpectrum SVar25;
  Vector3f wl;
  Point3fi o;
  Float pdf;
  float local_108;
  ulong uStack_100;
  Point3fi local_f8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  Float local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  Interval<float> local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 auVar20 [56];
  undefined1 auVar22 [64];
  
  auVar14._0_8_ = PiecewiseConstant2D::Sample(&this->distrib,u1,&local_6c);
  auVar14._8_56_ = extraout_var_00;
  local_c8 = vmovshdup_avx(auVar14._0_16_);
  local_d8._0_4_ = cosf(local_c8._0_4_);
  auVar15._0_4_ = sinf((float)local_c8._0_4_);
  auVar15._4_60_ = extraout_var;
  auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar15._0_16_);
  local_88._0_4_ = auVar15._0_4_;
  uVar6 = vcmpss_avx512f(auVar15._0_16_,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar7 = (bool)((byte)uVar6 & 1);
  fVar9 = (float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar4._0_4_);
  local_108 = auVar14._0_4_;
  fVar11 = cosf(local_108);
  local_c8 = ZEXT416((uint)(fVar11 * fVar9));
  fVar11 = sinf(local_108);
  fVar11 = fVar11 * fVar9;
  auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_d8._0_4_));
  uVar6 = vcmpss_avx512f(ZEXT416((uint)local_d8._0_4_),SUB6416(ZEXT464(0xbf800000),0),1);
  bVar7 = (bool)((byte)uVar6 & 1);
  auVar10._4_12_ = auVar4._4_12_;
  auVar10._0_4_ = (float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar4._0_4_);
  local_98._0_4_ = local_6c;
  uVar1 = (this->super_LightBase).mediumInterface.inside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  local_48._0_12_ = ZEXT812(0);
  local_48._12_4_ = 0;
  local_38.low = 0.0;
  local_38.high = 0.0;
  Transform::operator()(&local_f8,&(this->super_LightBase).renderFromLight,(Point3fi *)local_48);
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (this->super_LightBase).renderFromLight.m.m[0]
                                                    [1])),local_c8,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]));
  auVar24 = vfmadd231ss_fma(auVar24,auVar10,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (this->super_LightBase).renderFromLight.m.m[1][1]
                                         )),local_c8,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]));
  local_b8 = vfmadd231ss_fma(auVar8,auVar10,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (this->super_LightBase).renderFromLight.m.m[2][1]
                                         )),local_c8,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]));
  local_d8 = vfmadd231ss_fma(auVar8,auVar10,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  fVar9 = local_b8._0_4_;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar9)),auVar24,auVar24);
  auVar8 = vfmadd231ss_fma(auVar8,local_d8,local_d8);
  auVar13 = ZEXT816(0) << 0x40;
  if (0.0 < auVar8._0_4_) {
    auVar21._8_4_ = 0x7fffffff;
    auVar21._0_8_ = 0x7fffffff7fffffff;
    auVar21._12_4_ = 0x7fffffff;
    auVar2 = vandps_avx(auVar24,auVar21);
    auVar3 = vandps_avx(local_b8,auVar21);
    auVar21 = vandps_avx(local_d8,auVar21);
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ * 0.0)),auVar13,auVar2);
    auVar13 = vfmadd231ss_fma(auVar2,auVar13,auVar21);
    fVar12 = auVar13._0_4_ / auVar8._0_4_;
    fVar5 = auVar24._0_4_ * fVar12;
    local_68 = ZEXT416((uint)(fVar9 * fVar12));
    local_58 = ZEXT416((uint)(local_d8._0_4_ * fVar12));
    i.high = fVar5;
    i.low = fVar5;
    local_a8 = auVar24;
    auVar16._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&local_f8,i);
    auVar16._8_56_ = extraout_var_01;
    uVar6 = vmovlps_avx(auVar16._0_16_);
    local_f8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.low = (float)uVar6;
    local_f8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.high = (float)((ulong)uVar6 >> 0x20);
    i_00.high = (float)local_68._0_4_;
    i_00.low = (float)local_68._0_4_;
    auVar17._0_8_ =
         Interval<float>::operator+<float>
                   (&local_f8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i_00);
    auVar17._8_56_ = extraout_var_02;
    uVar6 = vmovlps_avx(auVar17._0_16_);
    local_f8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.low = (float)uVar6;
    local_f8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.high = (float)((ulong)uVar6 >> 0x20);
    i_01.high = (float)local_58._0_4_;
    i_01.low = (float)local_58._0_4_;
    auVar18._0_8_ =
         Interval<float>::operator+<float>
                   (&local_f8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,i_01);
    auVar18._8_56_ = extraout_var_03;
    auVar13 = ZEXT816(0) << 0x40;
    local_f8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .z = (Interval<float>)vmovlps_avx(auVar18._0_16_);
    auVar24 = local_a8;
  }
  uVar6 = vcmpss_avx512f(ZEXT416((uint)local_88._0_4_),auVar13,0);
  local_88._4_12_ = SUB6012((undefined1  [60])0x0,0);
  local_88._0_4_ =
       (uint)!(bool)((byte)uVar6 & 1) * (int)((float)local_98._0_4_ / (float)local_88._0_4_);
  local_98 = vinsertps_avx(auVar24,local_b8,0x10);
  auVar8._4_4_ = local_f8.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar8._0_4_ = local_f8.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar8._8_4_ = local_f8.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar8._12_4_ =
       local_f8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  local_a8._0_4_ =
       (local_f8.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
       local_f8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  auVar24 = vinsertps_avx(auVar8,ZEXT416((uint)local_f8.super_Point3<pbrt::Interval<float>_>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                               high),0x10);
  auVar13._0_4_ =
       local_f8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar24._0_4_;
  auVar13._4_4_ =
       local_f8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar24._4_4_;
  auVar13._8_4_ = auVar24._8_4_ + 0.0;
  auVar13._12_4_ = auVar24._12_4_ + 0.0;
  auVar24._8_4_ = 0x3f000000;
  auVar24._0_8_ = 0x3f0000003f000000;
  auVar24._12_4_ = 0x3f000000;
  local_b8 = vmulps_avx512vl(auVar13,auVar24);
  auVar24 = vinsertps_avx(local_c8,ZEXT416((uint)fVar11),0x10);
  uStack_100 = auVar4._8_8_;
  wl.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar24._0_8_;
  wl.super_Tuple3<pbrt::Vector3,_float>.z = auVar10._0_4_;
  auVar23 = ZEXT856(uStack_100);
  auVar20 = ZEXT856(auVar24._8_8_);
  SVar25 = Scale(this,wl,lambda);
  auVar22._0_8_ = SVar25.values.values._8_8_;
  auVar22._8_56_ = auVar23;
  auVar19._0_8_ = SVar25.values.values._0_8_;
  auVar19._8_56_ = auVar20;
  auVar4 = vmovlhps_avx(auVar19._0_16_,auVar22._0_16_);
  *(undefined1 (*) [16])(__return_storage_ptr__->L).values.values = auVar4;
  uVar6 = vmovlps_avx(local_b8);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar6;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar6 >> 0x20);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z = (float)local_a8._0_4_;
  uVar6 = vmovlps_avx(local_98);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar6;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar6 >> 0x20);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_d8._0_4_;
  (__return_storage_ptr__->ray).time = time;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = uVar1;
  (__return_storage_ptr__->intr).set = false;
  __return_storage_ptr__->pdfPos = 1.0;
  __return_storage_ptr__->pdfDir = (Float)local_88._0_4_;
  return __return_storage_ptr__;
}

Assistant:

LightLeSample GoniometricLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                         SampledWavelengths &lambda, Float time) const {
    Float pdf;
    Point2f uv = distrib.Sample(u1, &pdf);
    Float theta = uv[1], phi = uv[0];
    Float cosTheta = std::cos(theta), sinTheta = std::sin(theta);
    Vector3f wl = SphericalDirection(sinTheta, cosTheta, phi);
    Float pdfDir = sinTheta == 0 ? 0 : pdf / sinTheta;

    Ray ray = renderFromLight(Ray(Point3f(0, 0, 0), wl, time, mediumInterface.inside));
    return LightLeSample(Scale(wl, lambda), ray, 1, pdfDir);
}